

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O3

int test_loop(char *rom_filename,int num_log_lines,char *log_filename,uint32_t test_failed_address,
             int watch_reg)

{
  uint32_t uVar1;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  undefined8 extraout_RAX;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  uint32_t uVar17;
  ulong uVar18;
  int *piVar19;
  long alStack_60 [3];
  long local_48;
  uint32_t local_40;
  uint32_t local_3c;
  int local_38;
  uint local_34;
  
  uVar3 = (ulong)(uint)num_log_lines;
  gba_log_verbosity = 4;
  alStack_60[2] = 0x105eb9;
  local_40 = test_failed_address;
  local_34 = watch_reg;
  init_gbasystem(rom_filename,(char *)0x0,false);
  alStack_60[2] = 0x105ec8;
  skip_bios(cpu);
  alStack_60[uVar3 * -10 + 2] = 0x105ee8;
  load_log(log_filename,num_log_lines,(cpu_log_t *)((long)&stack0xffffffffffffffb8 + uVar3 * -0x50))
  ;
  if (1 < gba_log_verbosity) {
    sVar2 = mem->rom_size;
    alStack_60[uVar3 * -10 + 2] = 0x105f0b;
    printf("\x1b[0;36m[INFO]  ROM loaded: %lu bytes\n\x1b[0;m",sVar2);
    if (1 < gba_log_verbosity) {
      alStack_60[uVar3 * -10 + 2] = 0x105f25;
      printf("\x1b[0;36m[INFO]  Beginning CPU loop\n\x1b[0;m");
    }
  }
  local_48 = (long)num_log_lines;
  piVar19 = (int *)(&stack0x00000004 + uVar3 * -0x50);
  uVar18 = 0;
  iVar4 = 0;
  uVar9 = local_34;
  do {
    uVar1 = cpu->pc;
    uVar5 = (cpu->cpsr).raw;
    uVar10 = uVar5 & 0x20;
    uVar17 = (uVar1 + (uVar10 >> 4)) - 4;
    if ((long)uVar18 < local_48) {
      if (2 < gba_log_verbosity) {
        alStack_60[uVar3 * -10 + 2] = 0x105f8c;
        printf("[DEBUG] Checking registers against step %d (line %d in log)\n",uVar18 & 0xffffffff,
               (ulong)((int)uVar18 + 1));
        uVar1 = cpu->pc;
        uVar5 = (cpu->cpsr).raw;
        uVar10 = uVar5 & 0x20;
      }
      if (piVar19[-0x13] == ((uint)(uVar10 != 0) * 2 | 0xfffffffc) + uVar1) {
        uVar10 = piVar19[-0x11];
        if (uVar10 != uVar5) {
          alStack_60[uVar3 * -10 + 2] = 0x105fe1;
          printf("Expected cpsr: ");
          pcVar11 = "N";
          if (-1 < (int)uVar10) {
            pcVar11 = "-";
          }
          pcVar8 = "Z";
          if ((uVar10 >> 0x1e & 1) == 0) {
            pcVar8 = "-";
          }
          pcVar6 = "C";
          if ((uVar10 >> 0x1d & 1) == 0) {
            pcVar6 = "-";
          }
          pcVar13 = "V";
          if ((uVar10 >> 0x1c & 1) == 0) {
            pcVar13 = "-";
          }
          pcVar14 = "I";
          if (-1 < (char)uVar10) {
            pcVar14 = "-";
          }
          pcVar15 = "F";
          if ((uVar10 & 0x40) == 0) {
            pcVar15 = "-";
          }
          pcVar16 = "T";
          if ((uVar10 & 0x20) == 0) {
            pcVar16 = "-";
          }
          local_38 = iVar4;
          alStack_60[uVar3 * -10 + 2] = (long)pcVar16;
          alStack_60[uVar3 * -10 + 1] = (long)pcVar15;
          alStack_60[uVar3 * -10] = 0x106061;
          printf("[%s%s%s%s%s%s%s]",pcVar11,pcVar8,pcVar6,pcVar13,pcVar14);
          alStack_60[uVar3 * -10 + 2] = 0x106073;
          printf(" Actual cpsr: ");
          iVar4 = local_38;
          uVar9 = (cpu->cpsr).raw;
          pcVar11 = "N";
          if (-1 < (int)uVar9) {
            pcVar11 = "-";
          }
          pcVar8 = "Z";
          if ((uVar9 >> 0x1e & 1) == 0) {
            pcVar8 = "-";
          }
          pcVar6 = "C";
          if ((uVar9 >> 0x1d & 1) == 0) {
            pcVar6 = "-";
          }
          pcVar13 = "V";
          if ((uVar9 >> 0x1c & 1) == 0) {
            pcVar13 = "-";
          }
          pcVar14 = "I";
          if (-1 < (char)uVar9) {
            pcVar14 = "-";
          }
          pcVar15 = "F";
          if ((uVar9 & 0x40) == 0) {
            pcVar15 = "-";
          }
          pcVar16 = "T";
          if ((uVar9 & 0x20) == 0) {
            pcVar16 = "-";
          }
          local_3c = uVar17;
          alStack_60[uVar3 * -10 + 2] = (long)pcVar16;
          alStack_60[uVar3 * -10 + 1] = (long)pcVar15;
          alStack_60[uVar3 * -10] = 0x1060ff;
          printf("[%s%s%s%s%s%s%s]",pcVar11,pcVar8,pcVar6,pcVar13,pcVar14);
          alStack_60[uVar3 * -10 + 2] = 0x10610d;
          putchar(10);
          uVar5 = (cpu->cpsr).raw;
          uVar17 = local_3c;
        }
        uVar9 = local_34;
        if (piVar19[-0x10] != cpu->r[0]) goto LAB_001063d0;
        if (piVar19[-0xf] != cpu->r[1]) {
LAB_0010633a:
          alStack_60[uVar3 * -10 + 2] = 0x106344;
          test_loop_cold_3();
          goto LAB_00106344;
        }
        if (piVar19[-0xe] != cpu->r[2]) {
LAB_00106362:
          alStack_60[uVar3 * -10 + 2] = 0x10636c;
          test_loop_cold_4();
LAB_0010636c:
          alStack_60[uVar3 * -10 + 2] = 0x106376;
          test_loop_cold_13();
LAB_00106376:
          alStack_60[uVar3 * -10 + 2] = 0x106380;
          test_loop_cold_9();
LAB_00106380:
          alStack_60[uVar3 * -10 + 2] = 0x10638a;
          test_loop_cold_18();
LAB_0010638a:
          alStack_60[uVar3 * -10 + 2] = 0x106394;
          test_loop_cold_5();
LAB_00106394:
          alStack_60[uVar3 * -10 + 2] = 0x10639e;
          test_loop_cold_14();
          goto LAB_0010639e;
        }
        if (piVar19[-0xd] != cpu->r[3]) goto LAB_0010638a;
        if (piVar19[-0xc] != cpu->r[4]) goto LAB_001063bc;
        if (piVar19[-0xb] == cpu->r[5]) {
          if (piVar19[-10] != cpu->r[6]) {
LAB_0010634e:
            alStack_60[uVar3 * -10 + 2] = 0x106358;
            test_loop_cold_8();
LAB_00106358:
            alStack_60[uVar3 * -10 + 2] = 0x106362;
            test_loop_cold_17();
            goto LAB_00106362;
          }
          if (piVar19[-9] != cpu->r[7]) goto LAB_00106376;
          if ((uVar5 & 0x1f) != 0x11) {
            if (piVar19[-8] == cpu->r[8]) {
              if (piVar19[-7] != cpu->r[9]) goto LAB_001063da;
              if (piVar19[-6] != cpu->r[10]) goto LAB_00106344;
              lVar12 = 0x68;
              if (piVar19[-5] == cpu->r[0xb]) goto LAB_0010621b;
              goto LAB_0010636c;
            }
            goto LAB_001063a8;
          }
          if (piVar19[-8] != cpu->highreg_fiq[0]) goto LAB_001063a8;
          if (piVar19[-7] == cpu->highreg_fiq[1]) {
            if (piVar19[-6] != cpu->highreg_fiq[2]) {
LAB_00106344:
              alStack_60[uVar3 * -10 + 2] = 0x10634e;
              test_loop_cold_12();
              goto LAB_0010634e;
            }
            lVar12 = 0x7c;
            if (piVar19[-5] != cpu->highreg_fiq[3]) goto LAB_0010636c;
LAB_0010621b:
            if (piVar19[-4] != *(int *)((long)cpu->r + lVar12 + -0x38)) goto LAB_00106394;
            uVar7 = (uVar5 & 0x1f) - 0x11;
            lVar12 = 0x80;
            if (uVar7 < 0xb) {
              lVar12 = *(long *)(&DAT_00121780 + (ulong)uVar7 * 8);
            }
            if (piVar19[-3] == *(int *)((long)cpu->r + lVar12 + -0x38)) {
              lVar12 = 0x98;
              if (uVar7 < 0xb) {
                lVar12 = *(long *)(&DAT_001217d8 + (ulong)uVar7 * 8);
              }
              if (piVar19[-2] != *(int *)((long)cpu->r + lVar12 + -0x38)) {
                alStack_60[uVar3 * -10 + 2] = 0x10633a;
                test_loop_cold_16();
                goto LAB_0010633a;
              }
              if (piVar19[-1] != cpu->pc) goto LAB_00106358;
              if (uVar10 != uVar5) goto LAB_00106380;
              if ((iVar4 != *piVar19) && (gba_log_verbosity != 0)) {
                alStack_60[uVar3 * -10 + 2] = 0x1062ad;
                printf("\x1b[0;33m[WARN]  Cycles incorrect!\n\x1b[0;m");
              }
              alStack_60[uVar3 * -10 + 2] = 0x1062c1;
              iVar4 = arm7tdmi_step(cpu);
              if (piVar19[-0x12] == cpu->instr) goto LAB_001062de;
              goto LAB_001063b2;
            }
            goto LAB_001063c6;
          }
          goto LAB_001063da;
        }
      }
      else {
LAB_0010639e:
        alStack_60[uVar3 * -10 + 2] = 0x1063a8;
        test_loop_cold_1();
LAB_001063a8:
        alStack_60[uVar3 * -10 + 2] = 0x1063b2;
        test_loop_cold_10();
LAB_001063b2:
        alStack_60[uVar3 * -10 + 2] = 0x1063bc;
        test_loop_cold_19();
LAB_001063bc:
        alStack_60[uVar3 * -10 + 2] = 0x1063c6;
        test_loop_cold_6();
LAB_001063c6:
        alStack_60[uVar3 * -10 + 2] = 0x1063d0;
        test_loop_cold_15();
LAB_001063d0:
        alStack_60[uVar3 * -10 + 2] = 0x1063da;
        test_loop_cold_2();
LAB_001063da:
        alStack_60[uVar3 * -10 + 2] = 0x1063e4;
        test_loop_cold_11();
      }
      alStack_60[uVar3 * -10 + 2] = 0x1063ee;
      test_loop_cold_7();
      goto LAB_001063ee;
    }
    if ((int)uVar9 < 0) {
      return 0;
    }
    alStack_60[uVar3 * -10 + 2] = 0x1061d4;
    iVar4 = arm7tdmi_step(cpu);
LAB_001062de:
    uVar18 = uVar18 + 1;
    piVar19 = piVar19 + 0x14;
  } while (((int)uVar9 < 1) || (uVar17 != local_40));
  if (cpu->r[uVar9] == 0) {
    if (1 < gba_log_verbosity) {
      alStack_60[uVar3 * -10 + 2] = 0x10631f;
      printf("\x1b[0;36m[INFO]  Passed all tests!\n\x1b[0;m");
    }
    return 0;
  }
LAB_001063ee:
  alStack_60[uVar3 * -10 + 2] = (long)main;
  test_loop_cold_20();
  alStack_60[uVar3 * -10 + 2] = extraout_RAX;
  alStack_60[uVar3 * -10 + 1] = 0x106417;
  test_loop("thumb.gba",0x2e4,"thumb.log",0x800092e,7);
  alStack_60[uVar3 * -10 + 1] = 0x10641e;
  exit(0);
}

Assistant:

int test_loop(const char* rom_filename, int num_log_lines, const char* log_filename, word test_failed_address, int watch_reg) {
    log_set_verbosity(4);
    init_gbasystem(rom_filename, NULL, false);

    skip_bios(cpu);

    cpu_log_t lines[num_log_lines];

    load_log(log_filename, num_log_lines, lines);

    loginfo("ROM loaded: %lu bytes", mem->rom_size)
    loginfo("Beginning CPU loop")
    int step = 0;
    int cycles = 0;

    while(true) {
        word adjusted_pc = cpu->pc - (cpu->cpsr.thumb ? 2 : 4);
        if (step >= num_log_lines) {
            if (watch_reg < 0) {
                return 0; // We win!
            }
        } else {
            // Register values in the log are BEFORE EXECUTING the instruction on that line
            logdebug("Checking registers against step %d (line %d in log)", step, step + 1)
            ASSERT_EQUAL(adjusted_pc, "Address", lines[step].address, cpu->pc - (cpu->cpsr.thumb ? 2 : 4))

            if (lines[step].cpsr.raw != cpu->cpsr.raw) {
                printf("Expected cpsr: ");
                printcpsr(lines[step].cpsr);
                printf(" Actual cpsr: ");
                printcpsr(cpu->cpsr);
                printf("\n");
            }

            ASSERT_EQUAL(adjusted_pc, "r0", lines[step].r[0], get_register(cpu, 0))
            ASSERT_EQUAL(adjusted_pc, "r1", lines[step].r[1], get_register(cpu, 1))
            ASSERT_EQUAL(adjusted_pc, "r2", lines[step].r[2], get_register(cpu, 2))
            ASSERT_EQUAL(adjusted_pc, "r3", lines[step].r[3], get_register(cpu, 3))
            ASSERT_EQUAL(adjusted_pc, "r4", lines[step].r[4], get_register(cpu, 4))
            ASSERT_EQUAL(adjusted_pc, "r5", lines[step].r[5], get_register(cpu, 5))
            ASSERT_EQUAL(adjusted_pc, "r6", lines[step].r[6], get_register(cpu, 6))
            ASSERT_EQUAL(adjusted_pc, "r7", lines[step].r[7], get_register(cpu, 7))
            ASSERT_EQUAL(adjusted_pc, "r8", lines[step].r[8], get_register(cpu, 8))
            ASSERT_EQUAL(adjusted_pc, "r9", lines[step].r[9], get_register(cpu, 9))
            ASSERT_EQUAL(adjusted_pc, "r10", lines[step].r[10], get_register(cpu, 10))
            ASSERT_EQUAL(adjusted_pc, "r11", lines[step].r[11], get_register(cpu, 11))
            ASSERT_EQUAL(adjusted_pc, "r12", lines[step].r[12], get_register(cpu, 12))
            ASSERT_EQUAL(adjusted_pc, "r13 (SP)", lines[step].r[13], get_register(cpu, 13))
            ASSERT_EQUAL(adjusted_pc, "r14 (LR)", lines[step].r[14], get_register(cpu, 14))
            ASSERT_EQUAL(adjusted_pc, "r15 (PC)", lines[step].r[15], get_register(cpu, 15))
            ASSERT_EQUAL(adjusted_pc, "CPSR", lines[step].cpsr.raw, cpu->cpsr.raw)

            //ASSERT_EQUAL(adjusted_pc, "cycles", lines[step].cycles, cycles)
            if (cycles != lines[step].cycles) {
                logwarn("Cycles incorrect!")
            }
        }

        cycles = arm7tdmi_step(cpu);
        if (step < num_log_lines) {
            ASSERT_EQUAL(adjusted_pc, "instruction", lines[step].instruction, cpu->instr)
        }
        step++;

        if (adjusted_pc == test_failed_address && watch_reg > 0) {
            word failed_test = cpu->r[watch_reg];
            if (failed_test > 0) {
                logfatal("FAILED TEST: %d", failed_test)
            } else {
                loginfo("Passed all tests!")
                return 0;
            }
        }
    }
}